

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::AddMaximalReconvergence(ModifyMaximalReconvergence *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  IRContext *pIVar3;
  bool bVar4;
  uint32_t uVar5;
  FeatureManager *pFVar6;
  Operand *this_00;
  size_type sVar7;
  Instruction **ppIVar8;
  Instruction *pIVar9;
  long lVar10;
  bool bVar11;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  bool local_1d1;
  uint32_t id;
  uint local_1c4;
  uint32_t local_1c0 [3];
  Op local_1b4;
  long *local_1b0;
  Instruction *local_1a8;
  IRContext *local_1a0;
  initializer_list<spvtools::opt::Operand> local_198;
  Operand local_188;
  Op local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_points_with_mode;
  SmallVector<unsigned_int,_2UL> local_f0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Instruction extension;
  
  pFVar6 = IRContext::get_feature_mgr((this->super_Pass).context_);
  local_1d1 = EnumSet<spv::Capability>::contains(&pFVar6->capabilities_,Shader);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar8 = (Instruction **)
            ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    pIVar9 = *ppIVar8;
    bVar11 = pIVar9 == (Instruction *)
                       ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction>
                       + 8U);
    bVar4 = !bVar11;
    if (bVar11) break;
    Instruction::Instruction(&extension,pIVar9);
    this_00 = Instruction::GetOperand(&extension,0);
    Operand::AsString_abi_cxx11_((string *)&local_188,this_00);
    bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_188,"SPV_KHR_maximal_reconvergence");
    std::__cxx11::string::_M_dispose();
    Instruction::~Instruction(&extension);
    ppIVar8 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (!bVar11);
  entry_points_with_mode._M_h._M_buckets = &entry_points_with_mode._M_h._M_single_bucket;
  entry_points_with_mode._M_h._M_bucket_count = 1;
  entry_points_with_mode._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  entry_points_with_mode._M_h._M_element_count = 0;
  entry_points_with_mode._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  entry_points_with_mode._M_h._M_rehash_policy._M_next_resize = 0;
  entry_points_with_mode._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar8 = (Instruction **)
            ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  while (pIVar9 = *ppIVar8,
        pIVar9 != (Instruction *)
                  ((long)&(pMVar1->execution_modes_).super_IntrusiveList<spvtools::opt::Instruction>
                  + 8U)) {
    Instruction::Instruction(&extension,pIVar9);
    uVar5 = Instruction::GetSingleWordInOperand(&extension,1);
    if (uVar5 == 0x1787) {
      local_188.type = Instruction::GetSingleWordInOperand(&extension,0);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&entry_points_with_mode,&local_188.type);
    }
    Instruction::~Instruction(&extension);
    ppIVar8 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar8 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar9 = (Instruction *)
           ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  bVar11 = false;
  local_1a8 = pIVar9;
  while( true ) {
    pIVar2 = *ppIVar8;
    if (pIVar2 == pIVar9) break;
    Instruction::Instruction(&extension,pIVar2);
    id = Instruction::GetSingleWordInOperand(&extension,1);
    sVar7 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&entry_points_with_mode._M_h,&id);
    if (sVar7 == 0) {
      if (!bVar4) {
        pIVar3 = (this->super_Pass).context_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"SPV_KHR_maximal_reconvergence",(allocator<char> *)&local_f0
                  );
        IRContext::AddExtension(pIVar3,(string *)&local_188);
        std::__cxx11::string::_M_dispose();
      }
      if (local_1d1 == false) {
        IRContext::AddCapability((this->super_Pass).context_,Shader);
      }
      pIVar3 = (this->super_Pass).context_;
      local_1c0[2] = 0;
      local_1c0[1] = 0;
      local_1c0[0] = id;
      init_list._M_len = 1;
      init_list._M_array = local_1c0;
      local_1b4 = OpExecutionMode;
      local_1a0 = pIVar3;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list);
      local_188.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188.words,&local_f0);
      local_1c4 = 0x1787;
      init_list_00._M_len = 1;
      init_list_00._M_array = &local_1c4;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list_00);
      local_158 = OpExecutionMode;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,&local_c8);
      local_198._M_array = &local_188;
      local_198._M_len = 2;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_1b0,&local_1a0,&local_1b4,(int *)(local_1c0 + 2),
                 (int *)(local_1c0 + 1),&local_198);
      IRContext::AddExecutionMode
                (pIVar3,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_1b0);
      if (local_1b0 != (long *)0x0) {
        (**(code **)(*local_1b0 + 8))();
      }
      local_1b0 = (long *)0x0;
      lVar10 = 0x38;
      do {
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)((long)(local_188.words.buffer + -6) + lVar10))
        ;
        lVar10 = lVar10 + -0x30;
      } while (lVar10 != -0x28);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&entry_points_with_mode,&id);
      local_1d1 = true;
      bVar4 = true;
      bVar11 = true;
      pIVar9 = local_1a8;
    }
    Instruction::~Instruction(&extension);
    ppIVar8 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&entry_points_with_mode._M_h);
  return bVar11;
}

Assistant:

bool ModifyMaximalReconvergence::AddMaximalReconvergence() {
  bool changed = false;
  bool has_extension = false;
  bool has_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  for (auto extension : context()->extensions()) {
    if (extension.GetOperand(0).AsString() == "SPV_KHR_maximal_reconvergence") {
      has_extension = true;
      break;
    }
  }

  std::unordered_set<uint32_t> entry_points_with_mode;
  for (auto mode : get_module()->execution_modes()) {
    if (spv::ExecutionMode(mode.GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      entry_points_with_mode.insert(mode.GetSingleWordInOperand(0));
    }
  }

  for (auto entry_point : get_module()->entry_points()) {
    const uint32_t id = entry_point.GetSingleWordInOperand(1);
    if (!entry_points_with_mode.count(id)) {
      changed = true;
      if (!has_extension) {
        context()->AddExtension("SPV_KHR_maximal_reconvergence");
        has_extension = true;
      }
      if (!has_shader) {
        context()->AddCapability(spv::Capability::Shader);
        has_shader = true;
      }
      context()->AddExecutionMode(MakeUnique<Instruction>(
          context(), spv::Op::OpExecutionMode, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {id}},
              {SPV_OPERAND_TYPE_EXECUTION_MODE,
               {static_cast<uint32_t>(
                   spv::ExecutionMode::MaximallyReconvergesKHR)}}}));
      entry_points_with_mode.insert(id);
    }
  }

  return changed;
}